

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveglsl_tests.cpp
# Opt level: O0

void utest_register_arguments_parse_0(void)

{
  size_t sVar1;
  size_t sVar2;
  char *__s;
  char *name;
  size_t name_size;
  char *name_part;
  size_t index;
  
  sVar1 = utest_state.tests_length;
  utest_state.tests_length = utest_state.tests_length + 1;
  sVar2 = strlen("arguments.parse_0");
  __s = (char *)malloc(sVar2 + 1);
  utest_state.tests =
       (utest_test_state_s *)realloc(utest_state.tests,utest_state.tests_length * 0x18);
  utest_state.tests[sVar1].func = utest_arguments_parse_0;
  utest_state.tests[sVar1].name = __s;
  snprintf(__s,sVar2 + 1,"%s","arguments.parse_0");
  return;
}

Assistant:

UTEST(arguments, parse_0) {
    Arguments arguments;

    const char* args[] = {
        "liveglsl",
        "--input",
        "shader.frag",
        "--width",
        "300",
        "--height",
        "200"
    };

    T(ArgumentsParse(ARRAY_LENGTH(args), args, arguments));
    TSTR(arguments.Input.c_str(), "shader.frag");
    T(arguments.Width == 300);
    T(arguments.Height == 200);
}